

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.h
# Opt level: O0

bool mdns::sendData(int fd,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  uchar *__buf;
  size_type __n;
  ssize_t sVar1;
  long st;
  sockaddr_in broadcastAddr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  int fd_local;
  
  broadcastAddr.sin_zero = (uchar  [8])data;
  memset(&st,0,0x10);
  st._0_2_ = 2;
  st._2_2_ = htons(0x14e9);
  inet_aton("224.0.0.251",(in_addr *)((long)&st + 4));
  __buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)broadcastAddr.sin_zero
                    );
  __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)broadcastAddr.sin_zero);
  sVar1 = sendto(fd,__buf,__n,0,(sockaddr *)&st,0x10);
  if (-1 >= sVar1) {
    perror(" ! Failed to send request");
  }
  return -1 < sVar1;
}

Assistant:

bool sendData(const int fd, const std::vector<uint8_t> &data)
{
    sockaddr_in broadcastAddr{};
    broadcastAddr.sin_family = AF_INET;
    broadcastAddr.sin_port = htons(5353);
    inet_aton("224.0.0.251", &broadcastAddr.sin_addr);

    long st = sendto(
            fd,
            data.data(),
            data.size(),
            0,
            reinterpret_cast<const sockaddr*>(&broadcastAddr),
            sizeof(broadcastAddr));

    // todo check length
    if (st < 0) {
        perror(" ! Failed to send request");
        return false;
    }

    return true;
}